

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void idtx4x4_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  long lVar2;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  lVar2 = 0;
  auVar3 = pmovsxwd(in_XMM0,0x16a116a116a116a1);
  auVar4 = pmovsxwd(in_XMM1,0x800080008000800);
  for (; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    auVar5 = pmulld((undefined1  [16])*in,auVar3);
    piVar1 = (int *)((long)*out + lVar2);
    *piVar1 = auVar5._0_4_ + auVar4._0_4_ >> 0xc;
    piVar1[1] = auVar5._4_4_ + auVar4._4_4_ >> 0xc;
    piVar1[2] = auVar5._8_4_ + auVar4._8_4_ >> 0xc;
    piVar1[3] = auVar5._12_4_ + auVar4._12_4_ >> 0xc;
    in = in + col_num;
  }
  return;
}

Assistant:

static void idtx4x4_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  __m128i fact = _mm_set1_epi32(NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a_low;

  for (int i = 0; i < 4; i++) {
    a_low = _mm_mullo_epi32(in[i * col_num], fact);
    a_low = _mm_add_epi32(a_low, offset);
    out[i] = _mm_srai_epi32(a_low, NewSqrt2Bits);
  }
}